

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_20e753::LineEdit::focusInEvent(LineEdit *this,QFocusEvent *e)

{
  long lVar1;
  QArrayData *pQVar2;
  long in_FS_OFFSET;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text();
  pQVar2 = &((this->origText).d.d)->super_QArrayData;
  (this->origText).d.d = local_38;
  (this->origText).d.ptr = pcStack_30;
  (this->origText).d.size = local_28;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  QLineEdit::focusInEvent((QFocusEvent *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void focusInEvent(QFocusEvent *e) override
    {
        origText = text();
        QLineEdit::focusInEvent(e);
    }